

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-execution.h
# Opt level: O0

void wasm::
     LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
     ::scan(SimplifyLocals<false,_false,_true> *self,Expression **currp)

{
  bool bVar1;
  Block *pBVar2;
  Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
  *pWVar3;
  If *pIVar4;
  Loop *pLVar5;
  Break *pBVar6;
  Switch *pSVar7;
  Return *pRVar8;
  Call *pCVar9;
  CallRef *pCVar10;
  Try *pTVar11;
  TryTable *pTVar12;
  Throw *pTVar13;
  size_t sVar14;
  Expression **ppEVar15;
  BrOn *pBVar16;
  int local_64;
  int i_2;
  ExpressionList *list_2;
  int i_1;
  ExpressionList *list_1;
  Break *br;
  int i;
  ExpressionList *list;
  anon_class_16_2_f793d67d handleCall;
  Expression *curr;
  Expression **currp_local;
  SimplifyLocals<false,_false,_true> *self_local;
  
  handleCall.currp = (Expression ***)*currp;
  list = (ExpressionList *)&currp_local;
  handleCall.self = (SimplifyLocals<false,_false,_true> **)&curr;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  switch(((Expression *)handleCall.currp)->_id) {
  case InvalidId:
    handle_unreachable("bad id",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                       ,0x62);
  case BlockId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitBlock,currp);
    pBVar2 = Expression::cast<wasm::Block>((Expression *)handleCall.currp);
    bVar1 = IString::is(&(pBVar2->name).super_IString);
    if (bVar1) {
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                  *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
                 (Expression **)curr);
    }
    pBVar2 = Expression::cast<wasm::Block>((Expression *)handleCall.currp);
    sVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar2->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    br._4_4_ = (int)sVar14;
    while (br._4_4_ = br._4_4_ + -1, -1 < br._4_4_) {
      pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb);
      ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar2->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)br._4_4_);
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,ppEVar15);
    }
    break;
  case IfId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitIf,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pIVar4 = Expression::cast<wasm::If>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::maybePushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pIVar4->ifFalse);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pIVar4 = Expression::cast<wasm::If>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pIVar4->ifTrue);
    if (((ulong)currp_local[0x26] & 1) == 0) {
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                  *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
                 (Expression **)curr);
    }
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pIVar4 = Expression::cast<wasm::If>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pIVar4->condition);
    break;
  case LoopId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitLoop,currp);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pLVar5 = Expression::cast<wasm::Loop>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pLVar5->body);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    break;
  case BreakId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitBreak,currp);
    pBVar6 = Expression::cast<wasm::Break>((Expression *)handleCall.currp);
    if ((pBVar6->condition == (Expression *)0x0) || (((ulong)currp_local[0x26] & 1) == 0)) {
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                  *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
                 (Expression **)curr);
    }
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::maybePushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                     *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::scan,
                    &pBVar6->condition);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::maybePushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                     *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::scan,&pBVar6->value);
    break;
  case SwitchId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitSwitch,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pSVar7 = Expression::cast<wasm::Switch>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pSVar7->condition);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pSVar7 = Expression::cast<wasm::Switch>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::maybePushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pSVar7->value);
    break;
  case CallId:
    pCVar9 = Expression::cast<wasm::Call>((Expression *)handleCall.currp);
    scan::anon_class_16_2_f793d67d::operator()
              ((anon_class_16_2_f793d67d *)&list,(bool)(pCVar9->isReturn & 1));
    break;
  default:
    bVar1 = Properties::isControlFlowStructure((Expression *)handleCall.currp);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!Properties::isControlFlowStructure(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                    ,0xd1,
                    "static void wasm::LinearExecutionWalker<wasm::SimplifyLocals<false, false>>::scan(SubType *, Expression **) [SubType = wasm::SimplifyLocals<false, false>, VisitorType = wasm::Visitor<wasm::SimplifyLocals<false, false>>]"
                   );
    }
    bVar1 = Properties::isBranch((Expression *)handleCall.currp);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!Properties::isBranch(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/linear-execution.h"
                    ,0xd2,
                    "static void wasm::LinearExecutionWalker<wasm::SimplifyLocals<false, false>>::scan(SubType *, Expression **) [SubType = wasm::SimplifyLocals<false, false>, VisitorType = wasm::Visitor<wasm::SimplifyLocals<false, false>>]"
                   );
    }
    PostWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::scan((SimplifyLocals<false,_false,_true> *)currp_local,(Expression **)curr);
    break;
  case ReturnId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitReturn,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pRVar8 = Expression::cast<wasm::Return>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::maybePushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pRVar8->value);
    break;
  case UnreachableId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitUnreachable,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    break;
  case TryId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitTry,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pTVar11 = Expression::cast<wasm::Try>((Expression *)handleCall.currp);
    sVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar11->catchBodies).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    list_2._4_4_ = (int)sVar14;
    while (list_2._4_4_ = list_2._4_4_ + -1, -1 < list_2._4_4_) {
      pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb);
      ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar11->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)list_2._4_4_);
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,ppEVar15);
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                  *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
                 (Expression **)curr);
    }
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pTVar11 = Expression::cast<wasm::Try>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pTVar11->body);
    break;
  case TryTableId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitTryTable,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pTVar12 = Expression::cast<wasm::TryTable>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pTVar12->body);
    break;
  case ThrowId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitThrow,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    pTVar13 = Expression::cast<wasm::Throw>((Expression *)handleCall.currp);
    sVar14 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pTVar13->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    local_64 = (int)sVar14;
    while (local_64 = local_64 + -1, -1 < local_64) {
      pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb);
      ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,(long)local_64);
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,ppEVar15);
    }
    break;
  case RethrowId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitRethrow,currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
               (Expression **)curr);
    break;
  case CallRefId:
    pCVar10 = Expression::cast<wasm::CallRef>((Expression *)handleCall.currp);
    scan::anon_class_16_2_f793d67d::operator()
              ((anon_class_16_2_f793d67d *)&list,(bool)(pCVar10->isReturn & 1));
    break;
  case BrOnId:
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                   ).
                   super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
               ,Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                ::doVisitBrOn,currp);
    if (((ulong)currp_local[0x26] & 1) == 0) {
      Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                  *)(currp_local + 0xb),SimplifyLocals<false,_false,_true>::doNoteNonLinear,
                 (Expression **)curr);
    }
    pWVar3 = (Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
              *)(currp_local + 0xb);
    pBVar16 = Expression::cast<wasm::BrOn>((Expression *)handleCall.currp);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::pushTask(pWVar3,SimplifyLocals<false,_false,_true>::scan,&pBVar16->ref);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    auto handleCall = [&](bool isReturn) {
      if (!self->connectAdjacentBlocks) {
        // Control is nonlinear if we return, or if EH is enabled or may be.
        if (isReturn || !self->getModule() ||
            self->getModule()->features.hasExceptionHandling()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
      }

      // Scan the children normally.
      PostWalker<SubType, VisitorType>::scan(self, currp);
    };

    switch (curr->_id) {
      case Expression::Id::InvalidId:
        WASM_UNREACHABLE("bad id");
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doVisitBlock, currp);
        if (curr->cast<Block>()->name.is()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        auto& list = curr->cast<Block>()->list;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doVisitIf, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<If>()->ifFalse);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        break;
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doVisitLoop, currp);
        self->pushTask(SubType::scan, &curr->cast<Loop>()->body);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BreakId: {
        self->pushTask(SubType::doVisitBreak, currp);
        auto* br = curr->cast<Break>();
        // If there is no condition then we note non-linearity as the code after
        // us is unreachable anyhow (we do the same for Switch, Return, etc.).
        // If there is a condition, then we note or do not note depending on
        // whether we allow adjacent blocks.
        if (!br->condition || !self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->maybePushTask(SubType::scan, &br->condition);
        self->maybePushTask(SubType::scan, &br->value);
        break;
      }
      case Expression::Id::SwitchId: {
        self->pushTask(SubType::doVisitSwitch, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<Switch>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Switch>()->value);
        break;
      }
      case Expression::Id::ReturnId: {
        self->pushTask(SubType::doVisitReturn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Return>()->value);
        break;
      }
      case Expression::Id::CallId: {
        handleCall(curr->cast<Call>()->isReturn);
        return;
      }
      case Expression::Id::CallRefId: {
        handleCall(curr->cast<CallRef>()->isReturn);
        return;
      }
      case Expression::Id::TryId: {
        self->pushTask(SubType::doVisitTry, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Try>()->catchBodies;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doVisitTryTable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<TryTable>()->body);
        break;
      }
      case Expression::Id::ThrowId: {
        self->pushTask(SubType::doVisitThrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Throw>()->operands;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::RethrowId: {
        self->pushTask(SubType::doVisitRethrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::UnreachableId: {
        self->pushTask(SubType::doVisitUnreachable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BrOnId: {
        self->pushTask(SubType::doVisitBrOn, currp);
        if (!self->connectAdjacentBlocks) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<BrOn>()->ref);
        break;
      }
      default: {
        // All relevant things should have been handled.
        assert(!Properties::isControlFlowStructure(curr));
        assert(!Properties::isBranch(curr));
        // other node types do not have control flow, use regular post-order
        PostWalker<SubType, VisitorType>::scan(self, currp);
      }
    }
  }